

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31TestPackage.cpp
# Opt level: O0

int __thiscall deqp::gles31::TestPackage::init(TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Context *this_00;
  TestNode *pTVar1;
  TestPackage *this_local;
  
  this_00 = (Context *)operator_new(0x18);
  gles31::Context::Context(this_00,(this->super_TestPackage).super_TestNode.m_testCtx);
  this->m_context = this_00;
  pTVar1 = (TestNode *)operator_new(0x78);
  InfoTests::InfoTests((InfoTests *)pTVar1,this->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  gles31::Functional::FunctionalTests::FunctionalTests((FunctionalTests *)pTVar1,this->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Stress::StressTests::StressTests((StressTests *)pTVar1,this->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void TestPackage::init (void)
{
	try
	{
		// Create context
		m_context = new Context(m_testCtx);

		// Add main test groups
		addChild(new InfoTests						(*m_context));
		addChild(new Functional::FunctionalTests	(*m_context));
		addChild(new Stress::StressTests			(*m_context));
	}
	catch (...)
	{
		delete m_context;
		m_context = DE_NULL;

		throw;
	}
}